

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getkey.c
# Opt level: O0

int ffgnky(fitsfile *fptr,char *card,int *status)

{
  long bytepos_00;
  int iVar1;
  bool bVar2;
  long local_a0;
  char local_98 [8];
  char message [81];
  LONGLONG endhead;
  LONGLONG bytepos;
  int nrec;
  int jj;
  int *status_local;
  char *card_local;
  fitsfile *fptr_local;
  
  if (*status < 1) {
    if (fptr->HDUposition != fptr->Fptr->curhdu) {
      ffmahd(fptr,fptr->HDUposition + 1,(int *)0x0,status);
    }
    *card = '\0';
    bytepos_00 = fptr->Fptr->nextkey;
    if (fptr->Fptr->datastart + -0xb40 < fptr->Fptr->headend) {
      local_a0 = fptr->Fptr->headend;
    }
    else {
      local_a0 = fptr->Fptr->datastart + -0xb40;
    }
    stack0xffffffffffffffc0 = local_a0;
    if ((local_a0 < bytepos_00) || (bytepos_00 < fptr->Fptr->headstart[fptr->Fptr->curhdu])) {
      snprintf(local_98,0x51,"Cannot get keyword number %d.  It does not exist.",
               (ulong)((int)((bytepos_00 - fptr->Fptr->headstart[fptr->Fptr->curhdu]) / 0x50) + 1));
      ffpmsg(local_98);
      *status = 0xcb;
      fptr_local._4_4_ = 0xcb;
    }
    else {
      ffmbyt(fptr,bytepos_00,0,status);
      card[0x50] = '\0';
      iVar1 = ffgbyt(fptr,0x50,card,status);
      if (iVar1 < 1) {
        fptr->Fptr->nextkey = fptr->Fptr->nextkey + 0x50;
        bytepos._4_4_ = 0x4f;
        while( true ) {
          bVar2 = false;
          if (-1 < bytepos._4_4_) {
            bVar2 = card[bytepos._4_4_] == ' ';
          }
          if (!bVar2) break;
          bytepos._4_4_ = bytepos._4_4_ + -1;
        }
        card[bytepos._4_4_ + 1] = '\0';
      }
      fptr_local._4_4_ = *status;
    }
  }
  else {
    fptr_local._4_4_ = *status;
  }
  return fptr_local._4_4_;
}

Assistant:

int ffgnky(fitsfile *fptr,  /* I - FITS file pointer     */
           char *card,      /* O - card string           */
           int *status)     /* IO - error status         */
/*
  read the next keyword from the header - used internally by cfitsio
*/
{
    int jj, nrec;
    LONGLONG bytepos, endhead;
    char message[FLEN_ERRMSG];

    if (*status > 0)
        return(*status);

    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);

    card[0] = '\0';  /* make sure card is terminated, even affer read error */

/*
  Check that nextkey points to a legal keyword position.  Note that headend
  is the current end of the header, i.e., the position where a new keyword
  would be appended, however, if there are more than 1 FITS block worth of
  blank keywords at the end of the header (36 keywords per 2880 byte block)
  then the actual physical END card must be located at a starting position
  which is just 2880 bytes prior to the start of the data unit.
*/

    bytepos = (fptr->Fptr)->nextkey;
    endhead = maxvalue( ((fptr->Fptr)->headend), ((fptr->Fptr)->datastart - 2880) );

    /* nextkey must be < endhead and > than  headstart */
    if (bytepos > endhead ||  
        bytepos < (fptr->Fptr)->headstart[(fptr->Fptr)->curhdu] ) 
    {
        nrec= (int) ((bytepos - (fptr->Fptr)->headstart[(fptr->Fptr)->curhdu]) / 80 + 1);
        snprintf(message, FLEN_ERRMSG,"Cannot get keyword number %d.  It does not exist.",
                nrec);
        ffpmsg(message);
        return(*status = KEY_OUT_BOUNDS);
    }
      
    ffmbyt(fptr, bytepos, REPORT_EOF, status);  /* move to read pos. */

    card[80] = '\0';  /* make sure card is terminate, even if ffgbyt fails */

    if (ffgbyt(fptr, 80, card, status) <= 0) 
    {
        (fptr->Fptr)->nextkey += 80;   /* increment pointer to next keyword */

        /* strip off trailing blanks with terminated string */
        jj = 79;
        while (jj >= 0 && card[jj] == ' ')
               jj--;

        card[jj + 1] = '\0';
    }
    return(*status);
}